

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ReduceLayerParams::ByteSizeLong(ReduceLayerParams *this)

{
  ReduceLayerParams_ReduceOperation RVar1;
  ReduceLayerParams_ReduceAxis RVar2;
  int iVar3;
  size_t sVar4;
  float fVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ReduceLayerParams *this_local;
  
  sStack_18 = 0;
  RVar1 = mode(this);
  if (RVar1 != ReduceLayerParams_ReduceOperation_SUM) {
    RVar1 = mode(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(RVar1);
    sStack_18 = sStack_18 + 1;
  }
  fVar5 = epsilon(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  RVar2 = axis(this);
  if (RVar2 != ReduceLayerParams_ReduceAxis_CHW) {
    RVar2 = axis(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(RVar2);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t ReduceLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReduceLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  // float epsilon = 2;
  if (this->epsilon() != 0) {
    total_size += 1 + 4;
  }

  // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->axis());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}